

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

TValue * index2addr(lua_State *L,int idx)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  TValue *pTVar3;
  TValue *pTVar4;
  
  if (0 < idx) {
    pTVar4 = L->ci->func + (uint)idx;
    pTVar3 = &luaO_nilobject_;
    if (pTVar4 < L->top) {
      pTVar3 = pTVar4;
    }
    return pTVar3;
  }
  if (-0xf4628 < idx) {
    return L->top + idx;
  }
  if (idx == -0xf4628) {
    return &L->l_G->l_registry;
  }
  pTVar1 = L->ci->func;
  if (pTVar1->tt_ == 0x16) {
    return &luaO_nilobject_;
  }
  p_Var2 = (pTVar1->value_).f;
  pTVar3 = &luaO_nilobject_;
  if (-0xf4628 - idx <= (int)(uint)(byte)p_Var2[10]) {
    pTVar3 = (TValue *)(p_Var2 + (ulong)(-idx - 0xf4629) * 0x10 + 0x20);
  }
  return pTVar3;
}

Assistant:

static TValue *index2addr (lua_State *L, int idx) {
  CallInfo *ci = L->ci;
  if (idx > 0) {
    TValue *o = ci->func + idx;
    api_check(L, idx <= ci->top - (ci->func + 1), "unacceptable index");
    if (o >= L->top) return NONVALIDVALUE;
    else return o;
  }
  else if (!ispseudo(idx)) {  /* negative index */
    api_check(L, idx != 0 && -idx <= L->top - (ci->func + 1), "invalid index");
    return L->top + idx;
  }
  else if (idx == LUA_REGISTRYINDEX)
    return &G(L)->l_registry;
  else {  /* upvalues */
    idx = LUA_REGISTRYINDEX - idx;
    api_check(L, idx <= MAXUPVAL + 1, "upvalue index too large");
    if (ttislcf(ci->func))  /* light C function? */
      return NONVALIDVALUE;  /* it has no upvalues */
    else {
      CClosure *func = clCvalue(ci->func);
      return (idx <= func->nupvalues) ? &func->upvalue[idx-1] : NONVALIDVALUE;
    }
  }
}